

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

void imdct_step3_inner_s_loop_ld654(int n,float *e,int i_off,float *A,int base_n)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float *pfVar5;
  float k11;
  float k00;
  float *base;
  float *z;
  float A2;
  int a_off;
  int base_n_local;
  float *A_local;
  int i_off_local;
  float *e_local;
  int n_local;
  
  fVar1 = A[base_n >> 3];
  base = e + i_off;
  pfVar5 = base + -(long)(n << 4);
  for (; pfVar5 < base; base = base + -0x10) {
    fVar2 = *base;
    fVar3 = base[-1];
    *base = *base + base[-8];
    base[-1] = base[-1] + base[-9];
    base[-8] = fVar2 - base[-8];
    base[-9] = fVar3 - base[-9];
    fVar2 = base[-2];
    fVar3 = base[-10];
    fVar4 = base[-3];
    base[-2] = base[-2] + base[-10];
    base[-3] = base[-3] + base[-0xb];
    base[-10] = ((fVar2 - fVar3) + (fVar4 - base[-0xb])) * fVar1;
    base[-0xb] = ((fVar4 - base[-0xb]) - (fVar2 - fVar3)) * fVar1;
    fVar2 = base[-0xc];
    fVar3 = base[-4];
    fVar4 = base[-5];
    base[-4] = base[-4] + base[-0xc];
    base[-5] = base[-5] + base[-0xd];
    base[-0xc] = fVar4 - base[-0xd];
    base[-0xd] = fVar2 - fVar3;
    fVar2 = base[-0xe];
    fVar3 = base[-6];
    fVar4 = base[-7];
    base[-6] = base[-6] + base[-0xe];
    base[-7] = base[-7] + base[-0xf];
    base[-0xe] = ((fVar2 - fVar3) + (fVar4 - base[-0xf])) * fVar1;
    base[-0xf] = ((fVar2 - fVar3) - (fVar4 - base[-0xf])) * fVar1;
    iter_54(base);
    iter_54(base + -8);
  }
  return;
}

Assistant:

static void imdct_step3_inner_s_loop_ld654(int n, float *e, int i_off, float *A, int base_n)
{
   int a_off = base_n >> 3;
   float A2 = A[0+a_off];
   float *z = e + i_off;
   float *base = z - 16 * n;

   while (z > base) {
      float k00,k11;

      k00   = z[-0] - z[-8];
      k11   = z[-1] - z[-9];
      z[-0] = z[-0] + z[-8];
      z[-1] = z[-1] + z[-9];
      z[-8] =  k00;
      z[-9] =  k11 ;

      k00    = z[ -2] - z[-10];
      k11    = z[ -3] - z[-11];
      z[ -2] = z[ -2] + z[-10];
      z[ -3] = z[ -3] + z[-11];
      z[-10] = (k00+k11) * A2;
      z[-11] = (k11-k00) * A2;

      k00    = z[-12] - z[ -4];  // reverse to avoid a unary negation
      k11    = z[ -5] - z[-13];
      z[ -4] = z[ -4] + z[-12];
      z[ -5] = z[ -5] + z[-13];
      z[-12] = k11;
      z[-13] = k00;

      k00    = z[-14] - z[ -6];  // reverse to avoid a unary negation
      k11    = z[ -7] - z[-15];
      z[ -6] = z[ -6] + z[-14];
      z[ -7] = z[ -7] + z[-15];
      z[-14] = (k00+k11) * A2;
      z[-15] = (k00-k11) * A2;

      iter_54(z);
      iter_54(z-8);
      z -= 16;
   }
}